

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O2

string * __thiscall
duckdb::RenderTiming_abi_cxx11_(string *__return_storage_ptr__,duckdb *this,double timing)

{
  string *this_00;
  string timing_s;
  allocator local_b9;
  double local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  local_b8 = timing;
  if (1.0 <= timing) {
    ::std::__cxx11::string::string((string *)&local_30,"%.2f",&local_b9);
    Exception::ConstructMessage<double>(&local_90,&local_30,local_b8);
    ::std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_90);
    this_00 = &local_30;
  }
  else if (0.1 <= timing) {
    ::std::__cxx11::string::string((string *)&local_50,"%.3f",&local_b9);
    Exception::ConstructMessage<double>(&local_90,&local_50,local_b8);
    ::std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_90);
    this_00 = &local_50;
  }
  else {
    ::std::__cxx11::string::string((string *)&local_70,"%.4f",&local_b9);
    Exception::ConstructMessage<double>(&local_90,&local_70,local_b8);
    ::std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_90);
    this_00 = &local_70;
  }
  ::std::__cxx11::string::~string((string *)this_00);
  ::std::operator+(__return_storage_ptr__,&local_b0,"s");
  ::std::__cxx11::string::~string((string *)&local_b0);
  return __return_storage_ptr__;
}

Assistant:

static string RenderTiming(double timing) {
	string timing_s;
	if (timing >= 1) {
		timing_s = StringUtil::Format("%.2f", timing);
	} else if (timing >= 0.1) {
		timing_s = StringUtil::Format("%.3f", timing);
	} else {
		timing_s = StringUtil::Format("%.4f", timing);
	}
	return timing_s + "s";
}